

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

void pbrt::Printf<std::__cxx11::string,float&,float&,float&,float&>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               float *args_1,float *args_2,float *args_3,float *args_4)

{
  string s;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  detail::stringPrintfRecursive<std::__cxx11::string,float&,float&,float&,float&>
            (&local_30,fmt,args,args_1,args_2,args_3,args_4);
  fputs(local_30._M_dataplus._M_p,_stdout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Printf(const char *fmt, Args &&... args) {
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    fputs(s.c_str(), stdout);
}